

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O2

int metacall_serial_impl_deserialize_int(value *v,char *src,size_t length)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  ushort **ppuVar4;
  value pvVar5;
  ulong uVar6;
  
  ppuVar4 = __ctype_b_loc();
  cVar2 = *src;
  if (((((*ppuVar4)[cVar2] >> 0xb & 1) != 0) || (cVar2 == '-')) || (cVar2 == '+')) {
    uVar6 = 1;
    do {
      if (length <= uVar6) {
        iVar3 = atoi(src);
        pvVar5 = (value)value_create_int(iVar3);
        *v = pvVar5;
        return (uint)(pvVar5 == (value)0x0);
      }
      pcVar1 = src + uVar6;
      uVar6 = uVar6 + 1;
    } while ((*(byte *)((long)*ppuVar4 + (long)*pcVar1 * 2 + 1) & 8) != 0);
  }
  return 1;
}

Assistant:

int metacall_serial_impl_deserialize_int(value *v, const char *src, size_t length)
{
	size_t iterator;

	if (isdigit((int)src[0]) == 0 && src[0] != '-' && src[0] != '+')
	{
		return 1;
	}

	for (iterator = 1; iterator < length; ++iterator)
	{
		if (isdigit((int)src[iterator]) == 0)
		{
			return 1;
		}
	}

	*v = value_create_int(atoi(src));

	return (*v == NULL);
}